

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

float * ldr_to_hdr(stbi_uc *data,int x,int y,int comp)

{
  uint uVar1;
  float *pfVar2;
  long lVar3;
  uint uVar4;
  float *pfVar5;
  stbi_uc *psVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  
  uVar4 = x * y;
  pfVar2 = (float *)malloc((long)(int)(uVar4 * comp) << 2);
  if (pfVar2 == (float *)0x0) {
    free(data);
    failure_reason = "Out of memory";
    pfVar2 = (float *)0x0;
  }
  else {
    if (0 < (int)uVar4) {
      uVar1 = ((comp & 1U) + comp) - 1;
      lVar7 = (long)comp;
      uVar8 = 0;
      pfVar5 = pfVar2;
      psVar6 = data;
      do {
        uVar9 = 0;
        if (0 < (int)uVar1) {
          uVar9 = 0;
          do {
            dVar10 = pow((double)((float)psVar6[uVar9] / 255.0),(double)l2h_gamma);
            pfVar5[uVar9] = (float)dVar10 * l2h_scale;
            uVar9 = uVar9 + 1;
          } while (uVar1 != uVar9);
        }
        if ((int)uVar9 < comp) {
          lVar3 = (long)(int)uVar9 + uVar8 * lVar7;
          pfVar2[lVar3] = (float)data[lVar3] / 255.0;
        }
        uVar8 = uVar8 + 1;
        psVar6 = psVar6 + lVar7;
        pfVar5 = pfVar5 + lVar7;
      } while (uVar8 != uVar4);
    }
    free(data);
  }
  return pfVar2;
}

Assistant:

static float   *ldr_to_hdr(stbi_uc *data, int x, int y, int comp)
{
   int i,k,n;
   float *output = (float *) malloc(x * y * comp * sizeof(float));
   if (output == NULL) { free(data); return epf("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         output[i*comp + k] = (float) pow(data[i*comp+k]/255.0f, l2h_gamma) * l2h_scale;
      }
      if (k < comp) output[i*comp + k] = data[i*comp+k]/255.0f;
   }
   free(data);
   return output;
}